

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

DPSprite * __thiscall player_t::GetPSprite(player_t *this,PSPLayers layer)

{
  AWeapon *caller;
  DPSprite *this_00;
  AWeapon *pAVar1;
  
  if (layer < PSP_TARGETCENTER) {
    if (layer == PSP_STRIFEHANDS) {
      caller = (AWeapon *)this->mo;
    }
    else {
      caller = this->ReadyWeapon;
    }
  }
  else {
    if (this->mo == (APlayerPawn *)0x0) goto LAB_005579ad;
    caller = (AWeapon *)
             AActor::FindInventory
                       (&this->mo->super_AActor,
                        (PClassActor *)APowerTargeter::RegistrationInfo.MyClass,true);
  }
  if (caller == (AWeapon *)0x0) {
LAB_005579ad:
    __assert_fail("newcaller != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                  ,0xce,"DPSprite *player_t::GetPSprite(PSPLayers)");
  }
  this_00 = FindPSprite(this,layer);
  if (this_00 == (DPSprite *)0x0) {
    this_00 = (DPSprite *)
              M_Malloc_Dbg(0x88,
                           "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                           ,0x1f7);
    DPSprite::DPSprite(this_00,this,(AActor *)caller,layer);
  }
  else {
    pAVar1 = (AWeapon *)(this_00->Caller).field_0.p;
    if (pAVar1 != (AWeapon *)0x0) {
      if (((pAVar1->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20)
          == 0) goto LAB_0055795b;
      (this_00->Caller).field_0.p = (AActor *)0x0;
    }
  }
  pAVar1 = (AWeapon *)0x0;
LAB_0055795b:
  (this_00->Caller).field_0.p = (AActor *)caller;
  if (caller != pAVar1) {
    if (layer < PSP_TARGETCENTER) {
      this_00->Flags = 0xf;
      if (layer == PSP_STRIFEHANDS) {
        this_00->State = (FState *)0x0;
        this_00->y = 32.375;
      }
    }
    else {
      this_00->Flags = 0xc;
    }
    this_00->firstTic = true;
  }
  return this_00;
}

Assistant:

DPSprite *player_t::GetPSprite(PSPLayers layer)
{
	AActor *oldcaller = nullptr;
	AActor *newcaller = nullptr;

	if (layer >= PSP_TARGETCENTER)
	{
		if (mo != nullptr)
		{
			newcaller = mo->FindInventory(RUNTIME_CLASS(APowerTargeter), true);
		}
	}
	else if (layer == PSP_STRIFEHANDS)
	{
		newcaller = mo;
	}
	else
	{
		newcaller = ReadyWeapon;
	}

	assert(newcaller != nullptr);

	DPSprite *pspr = FindPSprite(layer);
	if (pspr == nullptr)
	{
		pspr = new DPSprite(this, newcaller, layer);
	}
	else
	{
		oldcaller = pspr->Caller;
	}

	// Always update the caller here in case we switched weapon
	// or if the layer was being used by something else before.
	pspr->Caller = newcaller;

	if (newcaller != oldcaller)
	{ // Only reset stuff if this layer was created now or if it was being used before.
		if (layer >= PSP_TARGETCENTER)
		{ // The targeter layers were affected by those.
			pspr->Flags = (PSPF_CVARFAST|PSPF_POWDOUBLE);
		}
		else
		{
			pspr->Flags = (PSPF_ADDWEAPON|PSPF_ADDBOB|PSPF_CVARFAST|PSPF_POWDOUBLE);
		}
		if (layer == PSP_STRIFEHANDS)
		{
			// Some of the old hacks rely on this layer coming from the FireHands state.
			// This is the ONLY time a psprite's state is actually null.
			pspr->State = nullptr;
			pspr->y = WEAPONTOP;
		}

		pspr->firstTic = true;
	}

	return pspr;
}